

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int CollectionCacheRelease(unqlite_col *pCol)

{
  unqlite_vm *puVar1;
  SyMemHeader *pSVar2;
  uint local_2c;
  sxu32 n;
  unqlite_vm *pVm;
  unqlite_col_record *pRec;
  unqlite_col_record *pNext;
  unqlite_col *pCol_local;
  
  puVar1 = pCol->pVm;
  pVm = (unqlite_vm *)pCol->pList;
  for (local_2c = 0; local_2c < pCol->nRec; local_2c = local_2c + 1) {
    pSVar2 = (pVm->sAlloc).apPool[3];
    jx9MemObjRelease((jx9_value *)&(pVm->sAlloc).pMethods);
    SyMemBackendPoolFree(&puVar1->sAlloc,pVm);
    pVm = (unqlite_vm *)pSVar2;
  }
  SyMemBackendFree(&puVar1->sAlloc,pCol->apRecord);
  pCol->nRecSize = 0;
  pCol->nRec = 0;
  pCol->pList = (unqlite_col_record *)0x0;
  return 0;
}

Assistant:

static int CollectionCacheRelease(unqlite_col *pCol)
{
	unqlite_col_record *pNext,*pRec = pCol->pList;
	unqlite_vm *pVm = pCol->pVm;
	sxu32 n;
	/* Discard all records */
	for( n = 0 ; n < pCol->nRec ; ++n ){
		pNext = pRec->pNext;
		jx9MemObjRelease(&pRec->sValue);
		SyMemBackendPoolFree(&pVm->sAlloc,(void *)pRec);
		/* Point to the next record */
		pRec = pNext;
	}
	SyMemBackendFree(&pVm->sAlloc,(void *)pCol->apRecord);
	pCol->nRec = pCol->nRecSize = 0;
	pCol->pList = 0;
	return UNQLITE_OK;
}